

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void jmp_patchval(FuncState *fs,BCPos list,BCPos vtarget,BCReg reg,BCPos dtarget)

{
  int iVar1;
  BCPos BVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  if (list != 0xffffffff) {
    do {
      lVar4 = (ulong)*(ushort *)((long)&fs->bcbase[list].ins + 2) - 0x8000;
      uVar5 = list + 1 + (int)lVar4;
      if (lVar4 == -1) {
        uVar5 = 0xffffffff;
      }
      iVar1 = jmp_patchtestreg(fs,list,reg);
      BVar2 = dtarget;
      if (iVar1 != 0) {
        BVar2 = vtarget;
      }
      uVar3 = (BVar2 - list) + 0x7fff;
      if (0xffff < uVar3) {
        err_syntax(fs->ls,LJ_ERR_XJUMP);
      }
      *(short *)((long)&fs->bcbase[list].ins + 2) = (short)uVar3;
      list = uVar5;
    } while (uVar5 != 0xffffffff);
  }
  return;
}

Assistant:

static void jmp_patchval(FuncState *fs, BCPos list, BCPos vtarget,
			 BCReg reg, BCPos dtarget)
{
  while (list != NO_JMP) {
    BCPos next = jmp_next(fs, list);
    if (jmp_patchtestreg(fs, list, reg))
      jmp_patchins(fs, list, vtarget);  /* Jump to target with value. */
    else
      jmp_patchins(fs, list, dtarget);  /* Jump to default target. */
    list = next;
  }
}